

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O0

void __thiscall proto2_unittest::TestOneof2::Clear(TestOneof2 *this)

{
  uint32_t *puVar1;
  Arena *arena;
  uint32_t cached_has_bits;
  TestOneof2 *this_local;
  
  puVar1 = google::protobuf::internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  if ((*puVar1 & 1) != 0) {
    arena = google::protobuf::MessageLite::GetArena((MessageLite *)this);
    google::protobuf::internal::ArenaStringPtr::ClearToDefault
              (&(this->field_0)._impl_.baz_string_,
               (LazyString *)Impl_::_i_give_permission_to_break_this_code_default_baz_string_,arena)
    ;
  }
  (this->field_0)._impl_.baz_int_ = 0;
  clear_foo(this);
  clear_bar(this);
  google::protobuf::internal::HasBits<1>::Clear(&(this->field_0)._impl_._has_bits_);
  google::protobuf::internal::InternalMetadata::Clear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void TestOneof2::Clear() {
// @@protoc_insertion_point(message_clear_start:proto2_unittest.TestOneof2)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  cached_has_bits = _impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000001u) != 0) {
    _impl_.baz_string_.ClearToDefault(::proto2_unittest::TestOneof2::Impl_::_i_give_permission_to_break_this_code_default_baz_string_, GetArena());
  }
  _impl_.baz_int_ = 0;
  clear_foo();
  clear_bar();
  _impl_._has_bits_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}